

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t robin_hood::hash_bytes(void *ptr,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = len * -0x395b586ca42e166b ^ 0xe17a1465;
  uVar2 = len >> 3;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = *(long *)((long)ptr + uVar3 * 8) * -0x395b586ca42e166b;
    uVar1 = ((uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b ^ uVar1) * -0x395b586ca42e166b;
  }
  switch((uint)len & 7) {
  case 7:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 6) << 0x30;
  case 6:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 5) << 0x28;
  case 5:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 4) << 0x20;
  case 4:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 3) << 0x18;
  case 3:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 2) << 0x10;
  case 2:
    uVar1 = uVar1 ^ (ulong)*(byte *)((long)ptr + uVar2 * 8 + 1) << 8;
  case 1:
    uVar1 = (*(byte *)((long)ptr + uVar2 * 8) ^ uVar1) * -0x395b586ca42e166b;
  case 0:
    uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

inline size_t hash_bytes(void const* ptr, size_t len) noexcept {
    static constexpr uint64_t m = UINT64_C(0xc6a4a7935bd1e995);
    static constexpr uint64_t seed = UINT64_C(0xe17a1465);
    static constexpr unsigned int r = 47;

    auto const* const data64 = static_cast<uint64_t const*>(ptr);
    uint64_t h = seed ^ (len * m);

    size_t const n_blocks = len / 8;
    for (size_t i = 0; i < n_blocks; ++i) {
        auto k = detail::unaligned_load<uint64_t>(data64 + i);

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;
    }

    auto const* const data8 = reinterpret_cast<uint8_t const*>(data64 + n_blocks);
    switch (len & 7U) {
    case 7:
        h ^= static_cast<uint64_t>(data8[6]) << 48U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 6:
        h ^= static_cast<uint64_t>(data8[5]) << 40U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 5:
        h ^= static_cast<uint64_t>(data8[4]) << 32U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 4:
        h ^= static_cast<uint64_t>(data8[3]) << 24U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 3:
        h ^= static_cast<uint64_t>(data8[2]) << 16U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 2:
        h ^= static_cast<uint64_t>(data8[1]) << 8U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 1:
        h ^= static_cast<uint64_t>(data8[0]);
        h *= m;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    default:
        break;
    }

    h ^= h >> r;
    h *= m;
    h ^= h >> r;
    return static_cast<size_t>(h);
}